

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECoordinates.cpp
# Opt level: O0

int CECoordinates::Observed2ICRS
              (double az,double zen,double *ra,double *dec,CEDate *date,CEObserver *observer,
              CEAngleType *angle_type)

{
  int iVar1;
  CEObserver *in_RCX;
  long *in_RDX;
  double *in_RSI;
  double *in_RDI;
  int *in_R8;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double unaff_retaddr;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000030;
  double in_stack_00000038;
  double in_stack_00000040;
  double in_stack_00000048;
  double in_stack_00000050;
  int err_code;
  
  if (*in_R8 == 0) {
    in_XMM0_Qa = in_XMM0_Qa * 0.017453292519943295;
    in_XMM1_Qa = in_XMM1_Qa * 0.017453292519943295;
  }
  (**(code **)(*in_RDX + 0x20))();
  CEObserver::Longitude_Rad(in_RCX);
  CEObserver::Latitude_Rad(in_RCX);
  CEObserver::Elevation_m(in_RCX);
  CEObserver::Pressure_hPa(in_RCX);
  CEObserver::Temperature_C(in_RCX);
  CEObserver::RelativeHumidity(in_RCX);
  CEDate::dut1((CEDate *)0x130f50);
  CEDate::xpolar((CEDate *)0x130f63);
  CEDate::ypolar((CEDate *)0x130f79);
  CEObserver::Wavelength_um(in_RCX);
  iVar1 = Observed2ICRS(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                        unaff_retaddr,in_XMM0_Qa,in_XMM1_Qa,(double)in_RDI,(double)in_RSI,
                        (double)in_RDX,in_stack_00000030,in_stack_00000038,in_stack_00000040,
                        in_stack_00000048,in_stack_00000050);
  if (*in_R8 == 0) {
    *in_RDI = *in_RDI * 57.29577951308232;
    *in_RSI = *in_RSI * 57.29577951308232;
  }
  return iVar1;
}

Assistant:

int CECoordinates::Observed2ICRS(double az, double zen,
                                 double *ra, double *dec,
                                 const CEDate&     date,
                                 const CEObserver& observer,
                                 const CEAngleType& angle_type)
{
    // Convert to radians if necessary
    if (angle_type == CEAngleType::DEGREES) {
        az *= DD2R ;
        zen *= DD2R ;
    }
    
    // Call the raw method
    int err_code = Observed2ICRS(az, zen, ra, dec, 
                  date.JD(),
                  observer.Longitude_Rad(), 
                  observer.Latitude_Rad(),
                  observer.Elevation_m(),
                  observer.Pressure_hPa(), 
                  observer.Temperature_C(),
                  observer.RelativeHumidity(),
                  date.dut1(),
                  date.xpolar(), 
                  date.ypolar(),
                  observer.Wavelength_um()) ;
    
    // Convert back to degrees if necessary
    if (angle_type == CEAngleType::DEGREES) {
        *ra *= DR2D ;
        *dec *= DR2D ;
    }
    
    return err_code ;
}